

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_func_call(SyntaxAnalyze *this)

{
  bool bVar1;
  SymbolKind SVar2;
  Word *str;
  Word *this_00;
  element_type *peVar3;
  element_type *peVar4;
  iterator this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long in_RSI;
  irGenerator *in_RDI;
  SharedExNdPtr SVar6;
  shared_ptr<front::express::ExpressNode> var;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range1;
  string retValue;
  string tmpPtrName;
  string strName;
  RightVal rightVal;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rightParams;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  params;
  SharedExNdPtr param;
  string name;
  SharedSyPtr func;
  SharedExNdPtr *node;
  ExpressNode *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  value_type *in_stack_fffffffffffffbd8;
  SyntaxAnalyze *in_stack_fffffffffffffbe0;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *this_02;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  ExpressNode *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc40;
  irGenerator *in_stack_fffffffffffffc48;
  irGenerator *this_03;
  shared_ptr<front::symbol::Symbol> local_310;
  string local_300 [32];
  string local_2e0 [28];
  Token in_stack_fffffffffffffd3c;
  SyntaxAnalyze *in_stack_fffffffffffffd40;
  string local_2b0 [4];
  TyKind in_stack_fffffffffffffd54;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  LeftVal *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  SymbolKind in_stack_fffffffffffffd74;
  string *in_stack_fffffffffffffd78;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_278;
  undefined1 *local_270;
  string local_268 [80];
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218 [2];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158;
  string local_138 [32];
  string local_118 [52];
  uint local_e4;
  string local_e0 [96];
  undefined1 local_80 [40];
  string local_58 [71];
  byte local_11;
  
  local_11 = 0;
  this_03 = in_RDI;
  operator_new(0x48);
  express::ExpressNode::ExpressNode(in_stack_fffffffffffffbf0);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8);
  std::shared_ptr<front::symbol::Symbol>::shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a72d3);
  std::__cxx11::string::string(local_58);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a72ed);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)0x2a72fa);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x2a7307);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2a7314);
  match_one_word(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
  str = get_least_matched_word((SyntaxAnalyze *)0x2a7332);
  word::Word::get_self_abi_cxx11_((Word *)in_stack_fffffffffffffbc8);
  std::__cxx11::string::operator=(local_58,local_e0);
  std::__cxx11::string::~string(local_e0);
  bVar1 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8), bVar1))
  {
    this_00 = get_least_matched_word((SyntaxAnalyze *)0x2a73e9);
    local_e4 = word::Word::get_line_num(this_00);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,unsigned_int>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffbd0,&in_stack_fffffffffffffbc8->_type);
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  }
  std::__cxx11::string::string(local_118,local_58);
  symbolTable::SymbolTable::find_least_layer_symbol
            ((SymbolTable *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             (string *)in_stack_fffffffffffffbe0);
  std::shared_ptr<front::symbol::Symbol>::operator=
            ((shared_ptr<front::symbol::Symbol> *)in_stack_fffffffffffffbd0,
             (shared_ptr<front::symbol::Symbol> *)in_stack_fffffffffffffbc8);
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a74ff)
  ;
  std::__cxx11::string::~string(local_118);
  match_one_word(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
  bVar1 = try_word(in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (Token)in_stack_fffffffffffffbd8);
  if (!bVar1) {
    bVar1 = std::operator==(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    if (bVar1) {
      std::__cxx11::string::string(local_138);
      std::__cxx11::string::string((string *)&local_158);
      match_one_word(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      get_least_matched_word((SyntaxAnalyze *)0x2a75c8);
      word::Word::get_self_abi_cxx11_((Word *)in_stack_fffffffffffffbc8);
      irGenerator::irGenerator::ir_declare_string(this_03,(string *)str);
      std::__cxx11::string::operator=(local_138,local_178);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((irGenerator *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                 in_stack_fffffffffffffd54);
      in_stack_fffffffffffffc40 = &local_158;
      std::__cxx11::string::operator=((string *)in_stack_fffffffffffffc40,local_1b8);
      std::__cxx11::string::~string(local_1b8);
      in_stack_fffffffffffffc48 = (irGenerator *)(in_RSI + 0x80);
      std::variant<int,std::__cxx11::string>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffbd0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbc8);
      std::variant<int,std::__cxx11::string>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffbd0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbc8);
      irGenerator::irGenerator::ir_ref
                ((irGenerator *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (LeftVal *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 (bool)in_stack_fffffffffffffd5f);
      std::
      variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2a76f5);
      std::
      variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2a7702);
      operator_new(0x48);
      express::ExpressNode::ExpressNode(in_stack_fffffffffffffbf0);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbd0,
                 in_stack_fffffffffffffbc8);
      in_stack_fffffffffffffc20 = local_218;
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbd0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbc8);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a775c);
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a7766);
      peVar4->_type = VAR;
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a7776);
      peVar4->_operation = PTR;
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a7787);
      std::__cxx11::string::operator=((string *)&peVar4->_name,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string(local_138);
    }
    else {
      gm_exp((SyntaxAnalyze *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbd0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbc8);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a78df);
    }
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 *)in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
    while (in_stack_fffffffffffffc1f =
                try_word(in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                         (Token)in_stack_fffffffffffffbd8), (bool)in_stack_fffffffffffffc1f) {
      match_one_word(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      gm_exp((SyntaxAnalyze *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbd0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbc8);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a7973);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
    }
  }
  match_one_word(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
  std::static_pointer_cast<front::symbol::FunctionSymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)in_stack_fffffffffffffbd8);
  peVar3 = std::
           __shared_ptr_access<front::symbol::FunctionSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::symbol::FunctionSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a79c6);
  SVar2 = symbol::FunctionSymbol::getRet(peVar3);
  std::shared_ptr<front::symbol::FunctionSymbol>::~shared_ptr
            ((shared_ptr<front::symbol::FunctionSymbol> *)0x2a79e1);
  if (SVar2 == INT) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
              ((irGenerator *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               in_stack_fffffffffffffd54);
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a7a18);
    peVar4->_type = VAR;
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a7a2b);
    peVar4->_operation = RETURN_FUNC_CALL;
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a7a3f);
    std::__cxx11::string::operator=((string *)&peVar4->_name,local_268);
    std::__cxx11::string::~string(local_268);
  }
  else {
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a7ac0);
    peVar4->_type = VAR;
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a7ad3);
    peVar4->_operation = VOID_FUNC_CALL;
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a7ae7);
    std::__cxx11::string::operator=((string *)&peVar4->_name,local_58);
  }
  local_270 = local_80;
  local_278._M_current =
       (shared_ptr<front::express::ExpressNode> *)
       std::
       vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
       ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                *)in_stack_fffffffffffffbc8);
  this_01 = std::
            vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)in_stack_fffffffffffffbc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                             *)in_stack_fffffffffffffbd0,
                            (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                             *)in_stack_fffffffffffffbc8), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
    ::operator*(&local_278);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbd0,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffbc8);
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a7b81);
    if (peVar4->_type == CNS) {
      std::
      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a7b93);
      std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffbd0,(int *)in_stack_fffffffffffffbc8);
    }
    else {
      std::
      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a7bde);
      std::variant<int,int,std::__cxx11::string>::operator=
                (in_stack_fffffffffffffc20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    }
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a7c1a);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
    ::operator++(&local_278);
  }
  peVar4 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a7c4a);
  std::__cxx11::string::string(local_2b0,(string *)&peVar4->_name);
  this_02 = (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)&stack0xfffffffffffffd40;
  std::static_pointer_cast<front::symbol::FunctionSymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)in_stack_fffffffffffffbd8);
  peVar3 = std::
           __shared_ptr_access<front::symbol::FunctionSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::symbol::FunctionSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a7c84);
  symbol::FunctionSymbol::getRet(peVar3);
  std::static_pointer_cast<front::symbol::FunctionSymbol,front::symbol::Symbol>(&local_310);
  std::__shared_ptr_access<front::symbol::FunctionSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<front::symbol::FunctionSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2a7cc7);
  symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffffbc8);
  irGenerator::irGenerator::getFunctionName(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffffc20,
           (vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  irGenerator::irGenerator::ir_function_call
            ((irGenerator *)this_01._M_current,in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
             in_stack_fffffffffffffd68,
             (vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this_02);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_300);
  std::shared_ptr<front::symbol::FunctionSymbol>::~shared_ptr
            ((shared_ptr<front::symbol::FunctionSymbol> *)0x2a7d6b);
  std::shared_ptr<front::symbol::FunctionSymbol>::~shared_ptr
            ((shared_ptr<front::symbol::FunctionSymbol> *)0x2a7d78);
  std::__cxx11::string::~string(local_2b0);
  local_11 = 1;
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2a7d9a);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this_02);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(this_02);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a7dc1);
  std::__cxx11::string::~string(local_58);
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a7ddb)
  ;
  _Var5._M_pi = extraout_RDX;
  if ((local_11 & 1) == 0) {
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a7f15);
    _Var5._M_pi = extraout_RDX_00;
  }
  SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (SharedExNdPtr)
         SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_func_call() {
  SharedExNdPtr node(new ExpressNode());
  SharedSyPtr func;
  string name;
  SharedExNdPtr param;
  vector<SharedExNdPtr> params;
  vector<RightVal> rightParams;
  RightVal rightVal;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();
  if (name == "starttime" || name == "stoptime") {
    rightVal.emplace<0>(get_least_matched_word().get_line_num());
    rightParams.push_back(rightVal);
  }

  func = symbolTable.find_least_layer_symbol(name);

  match_one_word(Token::LPARENT);
  if (!try_word(1, Token::RPARENT)) {
    if (name == "putf") {
      string strName;
      string tmpPtrName;

      match_one_word(Token::STRCON);

      strName =
          irGenerator.ir_declare_string(get_least_matched_word().get_self());
      tmpPtrName = irGenerator.getNewTmpValueName(TyKind::Ptr);
      irGenerator.ir_ref(tmpPtrName, strName);

      param = SharedExNdPtr(new ExpressNode());
      param->_type = NodeType::VAR;
      param->_operation = OperationType::PTR;
      param->_name = tmpPtrName;
    } else {
      param = gm_exp();
    }
    params.push_back(param);

    while (try_word(1, Token::COMMA)) {
      match_one_word(Token::COMMA);
      param = gm_exp();
      params.push_back(param);
    }
  }
  match_one_word(Token::RPARENT);

  if (std::static_pointer_cast<FunctionSymbol>(func)->getRet() ==
      SymbolKind::INT) {
    string retValue = irGenerator.getNewTmpValueName(TyKind::Int);
    node->_type = NodeType::VAR;
    node->_operation = OperationType::RETURN_FUNC_CALL;
    node->_name = retValue;
  } else {
    node->_type = NodeType::VAR;
    node->_operation = OperationType::VOID_FUNC_CALL;
    node->_name = name;
  }

  for (auto var : params) {
    if (var->_type == NodeType::CNS) {
      rightVal.emplace<0>(var->_value);
    } else {
      rightVal = var->_name;
    }
    rightParams.push_back(rightVal);
  }
  irGenerator.ir_function_call(
      node->_name, std::static_pointer_cast<FunctionSymbol>(func)->getRet(),
      irGenerator.getFunctionName(
          std::static_pointer_cast<FunctionSymbol>(func)->getName()),
      rightParams);

  return node;
}